

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalSample::Deserialize(LogicalSample *this,Deserializer *deserializer)

{
  tuple<duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_> this_00;
  pointer pLVar1;
  __uniq_ptr_impl<duckdb::LogicalSample,_std::default_delete<duckdb::LogicalSample>_> local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>.
  super__Head_base<0UL,_duckdb::LogicalSample_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>)
       operator_new(0x70);
  LogicalSample((LogicalSample *)
                this_00.
                super__Tuple_impl<0UL,_duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>
                .super__Head_base<0UL,_duckdb::LogicalSample_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>.
  super__Head_base<0UL,_duckdb::LogicalSample_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>)
       (tuple<duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>.
       super__Head_base<0UL,_duckdb::LogicalSample_*,_false>._M_head_impl;
  pLVar1 = unique_ptr<duckdb::LogicalSample,_std::default_delete<duckdb::LogicalSample>,_true>::
           operator->((unique_ptr<duckdb::LogicalSample,_std::default_delete<duckdb::LogicalSample>,_true>
                       *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>>
            (deserializer,200,"sample_options",&pLVar1->sample_options);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalSample_*,_std::default_delete<duckdb::LogicalSample>_>.
       super__Head_base<0UL,_duckdb::LogicalSample_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalSample::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalSample>(new LogicalSample());
	deserializer.ReadPropertyWithDefault<unique_ptr<SampleOptions>>(200, "sample_options", result->sample_options);
	return std::move(result);
}